

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O2

void __thiscall xs::posix::CaseListWriter::run(CaseListWriter *this)

{
  pointer pcVar1;
  deFileResult dVar2;
  long lVar3;
  long bufSize;
  long lVar4;
  deInt64 numWritten;
  
  lVar4 = 0;
  while( true ) {
    if (this->m_run != true) {
      return;
    }
    pcVar1 = (this->m_caseList).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->m_caseList).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar1;
    bufSize = lVar3 - lVar4;
    if (bufSize == 0 || lVar3 < lVar4) break;
    numWritten = 0;
    dVar2 = deFile_write(this->m_file,pcVar1 + lVar4,bufSize,&numWritten);
    if (dVar2 == DE_FILERESULT_SUCCESS) {
      lVar4 = lVar4 + numWritten;
    }
    else {
      if (dVar2 != DE_FILERESULT_WOULD_BLOCK) {
        return;
      }
      deSleep(1);
    }
  }
  return;
}

Assistant:

void CaseListWriter::run (void)
{
	deInt64 pos = 0;

	while (m_run && pos < (deInt64)m_caseList.size())
	{
		deInt64			numWritten	= 0;
		deFileResult	result		= deFile_write(m_file, &m_caseList[0] + pos, m_caseList.size()-pos, &numWritten);

		if (result == DE_FILERESULT_SUCCESS)
			pos += numWritten;
		else if (result == DE_FILERESULT_WOULD_BLOCK)
			deSleep(1); // Yield.
		else
			break; // Error.
	}
}